

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O3

Object * __thiscall Assimp::FBX::LazyObject::Get(LazyObject *this,bool dieOnError)

{
  size_type *psVar1;
  Object *pOVar2;
  Element *pEVar3;
  Token *pTVar4;
  char *__s1;
  _Alloc_hider _Var5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong uVar9;
  Cluster *this_00;
  MeshGeometry *this_01;
  ShapeGeometry *this_02;
  char **err_out;
  ulong *puVar10;
  pointer ppTVar11;
  undefined7 in_register_00000031;
  undefined8 uVar12;
  ulong uVar13;
  size_t __n;
  string name;
  string classtag;
  char *err;
  string local_e0;
  string local_c0;
  string local_a0;
  undefined4 local_7c;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  undefined1 local_58 [8];
  anon_union_8_2_0c989700_for_Token_4 *local_50 [2];
  anon_union_8_2_0c989700_for_Token_4 local_40 [2];
  
  if ((this->flags & 3) != 0) {
    return (Object *)0x0;
  }
  pOVar2 = (this->object)._M_t.
           super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
           .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl;
  if (pOVar2 != (Object *)0x0) {
    return pOVar2;
  }
  local_7c = (undefined4)CONCAT71(in_register_00000031,dieOnError);
  pEVar3 = this->element;
  ppTVar11 = (pEVar3->tokens).
             super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  err_out = (char **)((long)(pEVar3->tokens).
                            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11);
  if (err_out < (char **)0x11) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"expected at least 3 tokens: id, name and class tag","");
    Util::DOMError(&local_e0,this->element);
  }
  pTVar4 = pEVar3->key_token;
  ParseTokenAsString_abi_cxx11_(&local_e0,(FBX *)ppTVar11[1],(Token *)local_58,err_out);
  if (local_58 != (undefined1  [8])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,(char *)local_58,(allocator<char> *)&local_a0);
    Util::DOMError(&local_c0,this->element);
  }
  ppTVar11 = (pEVar3->tokens).
             super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((ppTVar11[1]->column == 0xffffffff) && (local_e0._M_string_length != 0)) {
    uVar13 = 0;
    uVar9 = local_e0._M_string_length;
    do {
      if ((local_e0._M_dataplus._M_p[uVar13] == '\0') &&
         (local_e0._M_dataplus._M_p[uVar13 + 1] == '\x01')) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_e0);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        puVar10 = (ulong *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_a0.field_2._M_allocated_capacity = *puVar10;
          local_a0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_a0.field_2._M_allocated_capacity = *puVar10;
          local_a0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_a0._M_string_length = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_e0);
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          uVar12 = local_a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_70 + local_a0._M_string_length) {
          uVar9 = 0xf;
          if (local_78 != local_68) {
            uVar9 = local_68[0];
          }
          if (uVar9 < local_70 + local_a0._M_string_length) goto LAB_005ebb36;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_78,0,(char *)0x0,(ulong)local_a0._M_dataplus._M_p);
        }
        else {
LAB_005ebb36:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_78);
        }
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        psVar1 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_c0.field_2._M_allocated_capacity = *psVar1;
          local_c0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar1;
          local_c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_c0._M_string_length = puVar8[1];
        *puVar8 = psVar1;
        puVar8[1] = 0;
        *(undefined1 *)psVar1 = 0;
        std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        uVar9 = local_e0._M_string_length;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0].line + 1);
          uVar9 = local_e0._M_string_length;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar9);
    ppTVar11 = (pEVar3->tokens).
               super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  ParseTokenAsString_abi_cxx11_(&local_c0,(FBX *)ppTVar11[2],(Token *)local_58,(char **)ppTVar11);
  if (local_58 != (undefined1  [8])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,(char *)local_58,(allocator<char> *)local_50);
    Util::DOMError(&local_a0,this->element);
  }
  *(byte *)&this->flags = (byte)this->flags | 1;
  __s1 = pTVar4->sbegin;
  __n = (long)pTVar4->send - (long)__s1;
  iVar6 = strncmp(__s1,"Geometry",__n);
  if (iVar6 == 0) {
    iVar6 = strcmp(local_c0._M_dataplus._M_p,"Mesh");
    if (iVar6 == 0) {
      this_01 = (MeshGeometry *)operator_new(0x3c8);
      MeshGeometry::MeshGeometry(this_01,this->id,this->element,&local_e0,this->doc);
      pOVar2 = (this->object)._M_t.
               super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
               .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl;
      (this->object)._M_t.
      super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
      .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl = (Object *)this_01;
      if (pOVar2 != (Object *)0x0) {
        (*pOVar2->_vptr_Object[1])();
      }
    }
    iVar6 = strcmp(local_c0._M_dataplus._M_p,"Shape");
    if (iVar6 == 0) {
      this_02 = (ShapeGeometry *)operator_new(0xa0);
      ShapeGeometry::ShapeGeometry(this_02,this->id,this->element,&local_e0,this->doc);
      pOVar2 = (this->object)._M_t.
               super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
               .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl;
      (this->object)._M_t.
      super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
      .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl = (Object *)this_02;
      if (pOVar2 != (Object *)0x0) {
        (*pOVar2->_vptr_Object[1])();
      }
    }
    iVar6 = strcmp(local_c0._M_dataplus._M_p,"Line");
    if (iVar6 != 0) goto LAB_005ec299;
    this_00 = (Cluster *)operator_new(0x88);
    LineGeometry::LineGeometry((LineGeometry *)this_00,this->id,this->element,&local_e0,this->doc);
  }
  else {
    iVar6 = strncmp(__s1,"NodeAttribute",__n);
    _Var5._M_p = local_c0._M_dataplus._M_p;
    if (iVar6 == 0) {
      iVar6 = strcmp(local_c0._M_dataplus._M_p,"Camera");
      if (iVar6 == 0) {
        this_00 = (Cluster *)operator_new(0x48);
        Camera::Camera((Camera *)this_00,this->id,this->element,this->doc,&local_e0);
      }
      else {
        iVar6 = strcmp(_Var5._M_p,"CameraSwitcher");
        if (iVar6 == 0) {
          this_00 = (Cluster *)operator_new(0x90);
          CameraSwitcher::CameraSwitcher
                    ((CameraSwitcher *)this_00,this->id,this->element,this->doc,&local_e0);
        }
        else {
          iVar6 = strcmp(_Var5._M_p,"Light");
          if (iVar6 == 0) {
            this_00 = (Cluster *)operator_new(0x48);
            Light::Light((Light *)this_00,this->id,this->element,this->doc,&local_e0);
          }
          else {
            iVar6 = strcmp(_Var5._M_p,"Null");
            if (iVar6 == 0) {
              this_00 = (Cluster *)operator_new(0x48);
              Null::Null((Null *)this_00,this->id,this->element,this->doc,&local_e0);
            }
            else {
              iVar6 = strcmp(_Var5._M_p,"LimbNode");
              if (iVar6 != 0) goto LAB_005ec299;
              this_00 = (Cluster *)operator_new(0x48);
              LimbNode::LimbNode((LimbNode *)this_00,this->id,this->element,this->doc,&local_e0);
            }
          }
        }
      }
    }
    else {
      iVar6 = strncmp(__s1,"Deformer",__n);
      _Var5._M_p = local_c0._M_dataplus._M_p;
      if (iVar6 == 0) {
        iVar6 = strcmp(local_c0._M_dataplus._M_p,"Cluster");
        if (iVar6 == 0) {
          this_00 = (Cluster *)operator_new(0x100);
          Cluster::Cluster(this_00,this->id,this->element,this->doc,&local_e0);
        }
        else {
          iVar6 = strcmp(_Var5._M_p,"Skin");
          if (iVar6 == 0) {
            this_00 = (Cluster *)operator_new(0x68);
            Skin::Skin((Skin *)this_00,this->id,this->element,this->doc,&local_e0);
          }
          else {
            iVar6 = strcmp(_Var5._M_p,"BlendShape");
            if (iVar6 == 0) {
              this_00 = (Cluster *)operator_new(0x60);
              BlendShape::BlendShape
                        ((BlendShape *)this_00,this->id,this->element,this->doc,&local_e0);
            }
            else {
              iVar6 = strcmp(_Var5._M_p,"BlendShapeChannel");
              if (iVar6 != 0) goto LAB_005ec299;
              this_00 = (Cluster *)operator_new(0x80);
              BlendShapeChannel::BlendShapeChannel
                        ((BlendShapeChannel *)this_00,this->id,this->element,this->doc,&local_e0);
            }
          }
        }
      }
      else {
        iVar6 = strncmp(__s1,"Model",__n);
        _Var5._M_p = local_c0._M_dataplus._M_p;
        if (iVar6 == 0) {
          iVar6 = strcmp(local_c0._M_dataplus._M_p,"IKEffector");
          if ((iVar6 == 0) || (iVar6 = strcmp(_Var5._M_p,"FKEffector"), iVar6 == 0))
          goto LAB_005ec299;
          this_00 = (Cluster *)operator_new(0xd0);
          Model::Model((Model *)this_00,this->id,this->element,this->doc,&local_e0);
        }
        else {
          iVar6 = strncmp(__s1,"Material",__n);
          if (iVar6 == 0) {
            this_00 = (Cluster *)operator_new(0xd0);
            FBX::Material::Material((Material *)this_00,this->id,this->element,this->doc,&local_e0);
          }
          else {
            iVar6 = strncmp(__s1,"Texture",__n);
            if (iVar6 == 0) {
              this_00 = (Cluster *)operator_new(0xf0);
              Texture::Texture((Texture *)this_00,this->id,this->element,this->doc,&local_e0);
            }
            else {
              iVar6 = strncmp(__s1,"LayeredTexture",__n);
              if (iVar6 == 0) {
                this_00 = (Cluster *)operator_new(0x58);
                LayeredTexture::LayeredTexture
                          ((LayeredTexture *)this_00,this->id,this->element,this->doc,&local_e0);
              }
              else {
                iVar6 = strncmp(__s1,"Video",__n);
                if (iVar6 == 0) {
                  this_00 = (Cluster *)operator_new(0xb8);
                  Video::Video((Video *)this_00,this->id,this->element,this->doc,&local_e0);
                }
                else {
                  iVar6 = strncmp(__s1,"AnimationStack",__n);
                  if (iVar6 == 0) {
                    this_00 = (Cluster *)operator_new(0x60);
                    AnimationStack::AnimationStack
                              ((AnimationStack *)this_00,this->id,this->element,&local_e0,this->doc)
                    ;
                  }
                  else {
                    iVar6 = strncmp(__s1,"AnimationLayer",__n);
                    if (iVar6 == 0) {
                      this_00 = (Cluster *)operator_new(0x50);
                      AnimationLayer::AnimationLayer
                                ((AnimationLayer *)this_00,this->id,this->element,&local_e0,
                                 this->doc);
                    }
                    else {
                      iVar6 = strncmp(__s1,"AnimationCurve",__n);
                      if (iVar6 == 0) {
                        this_00 = (Cluster *)operator_new(0x98);
                        AnimationCurve::AnimationCurve
                                  ((AnimationCurve *)this_00,this->id,this->element,&local_e0,
                                   this->doc);
                      }
                      else {
                        iVar6 = strncmp(__s1,"AnimationCurveNode",__n);
                        if (iVar6 != 0) goto LAB_005ec299;
                        this_00 = (Cluster *)operator_new(0xa8);
                        AnimationCurveNode::AnimationCurveNode
                                  ((AnimationCurveNode *)this_00,this->id,this->element,&local_e0,
                                   this->doc,(char **)0x0,0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pOVar2 = (this->object)._M_t.
           super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
           .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl;
  (this->object)._M_t.
  super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>.
  _M_t.
  super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
  .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl = (Object *)this_00;
  if (pOVar2 != (Object *)0x0) {
    (*pOVar2->_vptr_Object[1])();
  }
LAB_005ec299:
  *(byte *)&this->flags = (byte)this->flags & 0xfe;
  pOVar2 = (this->object)._M_t.
           super___uniq_ptr_impl<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_Assimp::FBX::Object_*,_std::default_delete<const_Assimp::FBX::Object>_>
           .super__Head_base<0UL,_const_Assimp::FBX::Object_*,_false>._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return pOVar2;
}

Assistant:

const Object* LazyObject::Get(bool dieOnError)
{
    if(IsBeingConstructed() || FailedToConstruct()) {
        return nullptr;
    }

    if (object.get()) {
        return object.get();
    }

    const Token& key = element.KeyToken();
    const TokenList& tokens = element.Tokens();

    if(tokens.size() < 3) {
        DOMError("expected at least 3 tokens: id, name and class tag",&element);
    }

    const char* err;
    std::string name = ParseTokenAsString(*tokens[1],err);
    if (err) {
        DOMError(err,&element);
    }

    // small fix for binary reading: binary fbx files don't use
    // prefixes such as Model:: in front of their names. The
    // loading code expects this at many places, though!
    // so convert the binary representation (a 0x0001) to the
    // double colon notation.
    if(tokens[1]->IsBinary()) {
        for (size_t i = 0; i < name.length(); ++i) {
            if (name[i] == 0x0 && name[i+1] == 0x1) {
                name = name.substr(i+2) + "::" + name.substr(0,i);
            }
        }
    }

    const std::string classtag = ParseTokenAsString(*tokens[2],err);
    if (err) {
        DOMError(err,&element);
    }

    // prevent recursive calls
    flags |= BEING_CONSTRUCTED;

    try {
        // this needs to be relatively fast since it happens a lot,
        // so avoid constructing strings all the time.
        const char* obtype = key.begin();
        const size_t length = static_cast<size_t>(key.end()-key.begin());

        // For debugging
        //dumpObjectClassInfo( objtype, classtag );

        if (!strncmp(obtype,"Geometry",length)) {
            if (!strcmp(classtag.c_str(),"Mesh")) {
                object.reset(new MeshGeometry(id,element,name,doc));
            }
            if (!strcmp(classtag.c_str(), "Shape")) {
                object.reset(new ShapeGeometry(id, element, name, doc));
            }
            if (!strcmp(classtag.c_str(), "Line")) {
                object.reset(new LineGeometry(id, element, name, doc));
            }
        }
        else if (!strncmp(obtype,"NodeAttribute",length)) {
            if (!strcmp(classtag.c_str(),"Camera")) {
                object.reset(new Camera(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"CameraSwitcher")) {
                object.reset(new CameraSwitcher(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"Light")) {
                object.reset(new Light(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"Null")) {
                object.reset(new Null(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"LimbNode")) {
                object.reset(new LimbNode(id,element,doc,name));
            }
        }
        else if (!strncmp(obtype,"Deformer",length)) {
            if (!strcmp(classtag.c_str(),"Cluster")) {
                object.reset(new Cluster(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"Skin")) {
                object.reset(new Skin(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(), "BlendShape")) {
                object.reset(new BlendShape(id, element, doc, name));
            }
            else if (!strcmp(classtag.c_str(), "BlendShapeChannel")) {
                object.reset(new BlendShapeChannel(id, element, doc, name));
            }
        }
        else if ( !strncmp( obtype, "Model", length ) ) {
            // FK and IK effectors are not supported
            if ( strcmp( classtag.c_str(), "IKEffector" ) && strcmp( classtag.c_str(), "FKEffector" ) ) {
                object.reset( new Model( id, element, doc, name ) );
            }
        }
        else if (!strncmp(obtype,"Material",length)) {
            object.reset(new Material(id,element,doc,name));
        }
        else if (!strncmp(obtype,"Texture",length)) {
            object.reset(new Texture(id,element,doc,name));
        }
        else if (!strncmp(obtype,"LayeredTexture",length)) {
            object.reset(new LayeredTexture(id,element,doc,name));
        }
        else if (!strncmp(obtype,"Video",length)) {
            object.reset(new Video(id,element,doc,name));
        }
        else if (!strncmp(obtype,"AnimationStack",length)) {
            object.reset(new AnimationStack(id,element,name,doc));
        }
        else if (!strncmp(obtype,"AnimationLayer",length)) {
            object.reset(new AnimationLayer(id,element,name,doc));
        }
        // note: order matters for these two
        else if (!strncmp(obtype,"AnimationCurve",length)) {
            object.reset(new AnimationCurve(id,element,name,doc));
        }
        else if (!strncmp(obtype,"AnimationCurveNode",length)) {
            object.reset(new AnimationCurveNode(id,element,name,doc));
        }
    }
    catch(std::exception& ex) {
        flags &= ~BEING_CONSTRUCTED;
        flags |= FAILED_TO_CONSTRUCT;

        if(dieOnError || doc.Settings().strictMode) {
            throw;
        }

        // note: the error message is already formatted, so raw logging is ok
        if(!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_ERROR(ex.what());
        }
        return NULL;
    }

    if (!object.get()) {
        //DOMError("failed to convert element to DOM object, class: " + classtag + ", name: " + name,&element);
    }

    flags &= ~BEING_CONSTRUCTED;
    return object.get();
}